

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O3

void mtree_quote(archive_string *s,char *str)

{
  byte *pbVar1;
  byte bVar2;
  undefined8 in_RAX;
  ulong uVar3;
  char *start;
  byte *pbVar4;
  char *pcVar5;
  char buf [4];
  undefined8 uStack_38;
  
  uVar3 = CONCAT71((int7)((ulong)in_RAX >> 8),*str);
  if (*str != '\0') {
    pbVar1 = (byte *)(str + 1);
    pcVar5 = str;
    uStack_38 = uVar3;
    do {
      pbVar4 = pbVar1;
      bVar2 = (byte)uVar3;
      if (""[uVar3 & 0xff] == '\0') {
        if (pbVar4 + -1 != (byte *)str) {
          archive_strncat(s,str,(long)pcVar5 - (long)str);
          bVar2 = pbVar4[-1];
        }
        uStack_38._0_5_ = CONCAT14(0x5c,(undefined4)uStack_38);
        uStack_38 = CONCAT17(bVar2,CONCAT16(bVar2 >> 3,CONCAT15(bVar2 >> 6,(undefined5)uStack_38)))
                    & 0x707ffffffffffff | 0x3030300000000000;
        archive_strncat(s,(void *)((long)&uStack_38 + 4),4);
        str = (char *)pbVar4;
      }
      uVar3 = (ulong)*pbVar4;
      pcVar5 = pcVar5 + 1;
      pbVar1 = pbVar4 + 1;
    } while (*pbVar4 != 0);
    if (pbVar4 != (byte *)str) {
      archive_strncat(s,str,(long)pcVar5 - (long)str);
    }
  }
  return;
}

Assistant:

static void
mtree_quote(struct archive_string *s, const char *str)
{
	const char *start;
	char buf[4];
	unsigned char c;

	for (start = str; *str != '\0'; ++str) {
		if (safe_char[*(const unsigned char *)str])
			continue;
		if (start != str)
			archive_strncat(s, start, str - start);
		c = (unsigned char)*str;
		buf[0] = '\\';
		buf[1] = (c / 64) + '0';
		buf[2] = (c / 8 % 8) + '0';
		buf[3] = (c % 8) + '0';
		archive_strncat(s, buf, 4);
		start = str + 1;
	}

	if (start != str)
		archive_strncat(s, start, str - start);
}